

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

void __thiscall
gl4cts::TextureViewTestViewSampling::initIterationSpecificProgramObject
          (TextureViewTestViewSampling *this)

{
  GLenum GVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  GLint GVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  TestError *pTVar7;
  ulong uVar8;
  string *psVar9;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar10;
  int local_9f0 [2];
  GLint link_status;
  uint n_varying_names;
  char *varying_names [4];
  char local_848 [8];
  char temp [1024];
  int local_440;
  GLint so_id;
  GLint compile_status;
  uint n_so_id;
  GLchar *shader_sources [5];
  GLuint local_408;
  uint n_so_ids;
  GLuint so_ids [5];
  GLchar *local_3e8;
  char *vs_body_raw_ptr;
  char *te_body_raw_ptr;
  char *tc_body_raw_ptr;
  char *gs_body_raw_ptr;
  char *fs_body_raw_ptr;
  allocator<char> local_399;
  string local_398 [8];
  string fs_string;
  char *fs_body;
  allocator<char> local_349;
  string local_348 [8];
  string gs_string;
  char *gs_body;
  allocator<char> local_2f9;
  string local_2f8 [8];
  string te_string;
  char *te_body;
  allocator<char> local_2a9;
  string local_2a8 [8];
  string tc_string;
  char *tc_body;
  allocator<char> local_259;
  string local_258 [8];
  string vs_string;
  char *vs_body;
  char *token_sample_fetch;
  char *token_sampler_declarations;
  char *token_n_samples;
  size_t token_location;
  string sample_fetch_fs_string;
  string sample_fetch_string;
  string sampler_declarations_string;
  stringstream n_samples_sstream;
  undefined1 local_190 [376];
  long local_18;
  Functions *gl;
  TextureViewTestViewSampling *this_local;
  
  gl = (Functions *)this;
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar6->_vptr_RenderContext[3])();
  local_18 = CONCAT44(extraout_var,iVar2);
  deinitIterationSpecificProgramAndShaderObjects(this);
  GVar3 = (**(code **)(local_18 + 0x3f0))(0x8b30);
  this->m_fs_id = GVar3;
  GVar3 = (**(code **)(local_18 + 0x3f0))(0x8dd9);
  this->m_gs_id = GVar3;
  GVar3 = (**(code **)(local_18 + 0x3f0))(0x8e88);
  this->m_tc_id = GVar3;
  GVar3 = (**(code **)(local_18 + 0x3f0))(0x8e87);
  this->m_te_id = GVar3;
  GVar3 = (**(code **)(local_18 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar3;
  dVar4 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar4,"glCreateShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x12fd);
  GVar3 = (**(code **)(local_18 + 0x3c8))();
  this->m_po_id = GVar3;
  dVar4 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar4,"glCreateProgram() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1300);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)(sampler_declarations_string.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sample_fetch_string.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sample_fetch_fs_string.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&token_location);
  std::ostream::operator<<(local_190,this->m_iteration_parent_texture_n_samples);
  GVar1 = this->m_iteration_view_texture_target;
  if (GVar1 == 0xde0) {
    std::__cxx11::string::operator=
              ((string *)(sample_fetch_string.field_2._M_local_buf + 8),"uniform sampler1D texture;"
              );
    std::__cxx11::string::operator=
              ((string *)(sample_fetch_fs_string.field_2._M_local_buf + 8),
               "vec4 current_sample = textureLod(texture, 0.5,        lod);\n");
    std::__cxx11::string::operator=
              ((string *)&token_location,
               "vec4 current_sample = textureLod(texture, gs_fs_uv.x, lod);\n");
  }
  else if (GVar1 == 0xde1) {
    std::__cxx11::string::operator=
              ((string *)(sample_fetch_string.field_2._M_local_buf + 8),"uniform sampler2D texture;"
              );
    std::__cxx11::string::operator=
              ((string *)(sample_fetch_fs_string.field_2._M_local_buf + 8),
               "vec4 current_sample = textureLod(texture, vec2(0.5), lod);\n");
    std::__cxx11::string::operator=
              ((string *)&token_location,
               "vec4 current_sample = textureLod(texture, gs_fs_uv, lod);\n");
  }
  else if (GVar1 == 0x806f) {
    std::__cxx11::string::operator=
              ((string *)(sample_fetch_string.field_2._M_local_buf + 8),
               "uniform sampler3D texture;uniform float     z_float;");
    std::__cxx11::string::operator=
              ((string *)(sample_fetch_fs_string.field_2._M_local_buf + 8),
               "vec4 current_sample = textureLod(texture, vec3(vec2(0.5), z_float), lod);\n");
    std::__cxx11::string::operator=
              ((string *)&token_location,
               "vec4 current_sample = textureLod(texture, vec3(gs_fs_uv, z_float), lod);\n");
  }
  else if (GVar1 == 0x84f5) {
    std::__cxx11::string::operator=
              ((string *)(sample_fetch_string.field_2._M_local_buf + 8),
               "uniform sampler2DRect texture;");
    std::__cxx11::string::operator=
              ((string *)(sample_fetch_fs_string.field_2._M_local_buf + 8),
               "ivec2 texture_size   = textureSize(texture);\nvec4  current_sample = texelFetch (texture, texture_size / ivec2(2));\n"
              );
    std::__cxx11::string::operator=
              ((string *)&token_location,
               "ivec2 texture_size   = textureSize(texture);\nvec4  current_sample = texelFetch (texture, ivec2(gs_fs_uv.xy * vec2(texture_size)));\n"
              );
  }
  else if (GVar1 == 0x8513) {
    std::__cxx11::string::operator=
              ((string *)(sample_fetch_string.field_2._M_local_buf + 8),
               "uniform samplerCube texture;\nuniform int         n_face;");
    std::__cxx11::string::operator=
              ((string *)(sample_fetch_fs_string.field_2._M_local_buf + 8),
               "vec4 current_sample;\n\nswitch (n_face)\n{\n    case 0: current_sample = textureLod(texture, vec3( 1,  0,  0), lod); break;\n    case 1: current_sample = textureLod(texture, vec3(-1,  0,  0), lod); break;\n    case 2: current_sample = textureLod(texture, vec3( 0,  1,  0), lod); break;\n    case 3: current_sample = textureLod(texture, vec3( 0, -1,  0), lod); break;\n    case 4: current_sample = textureLod(texture, vec3( 0,  0,  1), lod); break;\n    case 5: current_sample = textureLod(texture, vec3( 0,  0, -1), lod); break;\n}\n"
              );
    std::__cxx11::string::operator=
              ((string *)&token_location,
               "vec4 current_sample;\n\nswitch (n_face)\n{\n    case 0: current_sample = textureLod(texture, normalize(vec3( 1, gs_fs_uv.xy)), lod); break;\n    case 1: current_sample = textureLod(texture, normalize(vec3(-1, gs_fs_uv.xy)), lod); break;\n    case 2: current_sample = textureLod(texture, normalize(vec3( gs_fs_uv.x, 1,  gs_fs_uv.y)), lod); break;\n    case 3: current_sample = textureLod(texture, normalize(vec3( gs_fs_uv.x, -1, gs_fs_uv.y)), lod); break;\n    case 4: current_sample = textureLod(texture, normalize(vec3( gs_fs_uv.xy,  1)), lod); break;\n    case 5: current_sample = textureLod(texture, normalize(vec3( gs_fs_uv.xy, -1)), lod); break;\n}\n"
              );
  }
  else if (GVar1 == 0x8c18) {
    std::__cxx11::string::operator=
              ((string *)(sample_fetch_string.field_2._M_local_buf + 8),
               "uniform sampler1DArray texture;\nuniform float          z_float;\n");
    std::__cxx11::string::operator=
              ((string *)(sample_fetch_fs_string.field_2._M_local_buf + 8),
               "vec4 current_sample = textureLod(texture, vec2(0.5, z_float), lod);\n");
    std::__cxx11::string::operator=
              ((string *)&token_location,
               "vec4 current_sample = textureLod(texture, vec2(gs_fs_uv.x, z_float), lod);\n");
  }
  else if (GVar1 == 0x8c1a) {
    std::__cxx11::string::operator=
              ((string *)(sample_fetch_string.field_2._M_local_buf + 8),
               "uniform float          z_float;\nuniform sampler2DArray texture;");
    std::__cxx11::string::operator=
              ((string *)(sample_fetch_fs_string.field_2._M_local_buf + 8),
               "vec4 current_sample = textureLod(texture, vec3(vec2(0.5), z_float), lod);\n");
    std::__cxx11::string::operator=
              ((string *)&token_location,
               "vec4 current_sample = textureLod(texture, vec3(gs_fs_uv, z_float), lod);\n");
  }
  else if (GVar1 == 0x9009) {
    std::__cxx11::string::operator=
              ((string *)(sample_fetch_string.field_2._M_local_buf + 8),
               "uniform samplerCubeArray texture;\nuniform int              n_face;\nuniform float            z_float;\n"
              );
    std::__cxx11::string::operator=
              ((string *)(sample_fetch_fs_string.field_2._M_local_buf + 8),
               "vec4 current_sample;\n\nswitch (n_face)\n{\n    case 0: current_sample = textureLod(texture, vec4( 1,  0,  0, z_float), lod); break;\n    case 1: current_sample = textureLod(texture, vec4(-1,  0,  0, z_float), lod); break;\n    case 2: current_sample = textureLod(texture, vec4( 0,  1,  0, z_float), lod); break;\n    case 3: current_sample = textureLod(texture, vec4( 0, -1,  0, z_float), lod); break;\n    case 4: current_sample = textureLod(texture, vec4( 0,  0,  1, z_float), lod); break;\n    case 5: current_sample = textureLod(texture, vec4( 0,  0, -1, z_float), lod); break;\n}\n"
              );
    std::__cxx11::string::operator=
              ((string *)&token_location,
               "vec4 current_sample;\n\nswitch (n_face)\n{\n    case 0: current_sample = textureLod(texture, vec4(normalize(vec3( 1, gs_fs_uv.xy)), z_float), lod); break;\n    case 1: current_sample = textureLod(texture, vec4(normalize(vec3(-1, gs_fs_uv.xy)), z_float), lod); break;\n    case 2: current_sample = textureLod(texture, vec4(normalize(vec3( gs_fs_uv.x, 1,  gs_fs_uv.y)), z_float), lod); break;\n    case 3: current_sample = textureLod(texture, vec4(normalize(vec3( gs_fs_uv.x, -1,  gs_fs_uv.y)), z_float), lod); break;\n    case 4: current_sample = textureLod(texture, vec4(normalize(vec3( gs_fs_uv.xy, 1)), z_float), lod); break;\n    case 5: current_sample = textureLod(texture, vec4(normalize(vec3( gs_fs_uv.xy, -1)), z_float), lod); break;\n}\n"
              );
  }
  else if (GVar1 == 0x9100) {
    std::__cxx11::string::operator=
              ((string *)(sample_fetch_string.field_2._M_local_buf + 8),
               "uniform sampler2DMS texture;");
    std::__cxx11::string::operator=
              ((string *)(sample_fetch_fs_string.field_2._M_local_buf + 8),
               "ivec2 texture_size   = textureSize(texture);\nvec4  current_sample = texelFetch (texture,\n                                   ivec2(texture_size.xy / ivec2(2)),\n                                   n_sample);\n"
              );
    std::__cxx11::string::operator=
              ((string *)&token_location,
               "ivec2 texture_size   = textureSize(texture);\nvec4  current_sample = texelFetch (texture,\n                                   ivec2(gs_fs_uv * vec2(texture_size)),\n                                   n_sample);\n"
              );
  }
  else {
    if (GVar1 != 0x9102) {
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Unrecognized texture target",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0x13d7);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator=
              ((string *)(sample_fetch_string.field_2._M_local_buf + 8),
               "uniform sampler2DMSArray texture;uniform int              z_int;\n");
    std::__cxx11::string::operator=
              ((string *)(sample_fetch_fs_string.field_2._M_local_buf + 8),
               "ivec3 texture_size   = textureSize(texture);\nvec4  current_sample = texelFetch (texture,\n                                   ivec3(texture_size.xy / ivec2(2), z_int),\n                                   n_sample);\n"
              );
    std::__cxx11::string::operator=
              ((string *)&token_location,
               "ivec3 texture_size = textureSize(texture);\nvec4  current_sample = texelFetch (texture,\n                                   ivec3(ivec2(gs_fs_uv * vec2(texture_size).xy), z_int),\n                                   n_sample);\n"
              );
  }
  vs_string.field_2._8_8_ = anon_var_dwarf_2fb300;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_258,
             "#version 400\n\nuniform float lod;\nuniform vec4 reference_colors[N_SAMPLES];\nSAMPLER_DECLARATIONS\n\nout int vs_tc_vs_sampling_result;\n\nvoid main()\n{\n    const float epsilon = 1.0 / 255.0;\n\n    vs_tc_vs_sampling_result = 1;\n\n    for (int n_sample = 0; n_sample < N_SAMPLES; ++n_sample)\n    {\n        SAMPLE_FETCH;\n\n        if (abs(current_sample.x - reference_colors[n_sample].x) > epsilon ||\n            abs(current_sample.y - reference_colors[n_sample].y) > epsilon ||\n            abs(current_sample.z - reference_colors[n_sample].z) > epsilon ||\n            abs(current_sample.w - reference_colors[n_sample].w) > epsilon)\n        {\n            vs_tc_vs_sampling_result = int(current_sample.x * 256.0);\n\n            break;\n        }\n    }\n\n    gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n}\n"
             ,&local_259);
  std::allocator<char>::~allocator(&local_259);
  while (uVar8 = std::__cxx11::string::find((char *)local_258,0x2a4f371),
        uVar8 != 0xffffffffffffffff) {
    psVar9 = (string *)strlen("N_SAMPLES");
    std::__cxx11::stringstream::str();
    std::__cxx11::string::replace((ulong)local_258,uVar8,psVar9);
    std::__cxx11::string::~string((string *)&tc_body);
  }
  while (uVar8 = std::__cxx11::string::find((char *)local_258,0x2a4f37b),
        uVar8 != 0xffffffffffffffff) {
    psVar9 = (string *)strlen("SAMPLER_DECLARATIONS");
    std::__cxx11::string::replace((ulong)local_258,uVar8,psVar9);
  }
  while (uVar8 = std::__cxx11::string::find((char *)local_258,0x2a4f390),
        uVar8 != 0xffffffffffffffff) {
    psVar9 = (string *)strlen("SAMPLE_FETCH");
    std::__cxx11::string::replace((ulong)local_258,uVar8,psVar9);
  }
  tc_string.field_2._8_8_ = anon_var_dwarf_2fb319;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2a8,
             "#version 400\n\nlayout(vertices = 1) out;\n\nuniform float lod;\nuniform vec4  reference_colors[N_SAMPLES];\nSAMPLER_DECLARATIONS\n\nin  int vs_tc_vs_sampling_result[];\nout int tc_te_vs_sampling_result[];\nout int tc_te_tc_sampling_result[];\n\nvoid main()\n{\n    const float epsilon = 1.0 / 255.0;\n\n    tc_te_vs_sampling_result[gl_InvocationID] = vs_tc_vs_sampling_result[gl_InvocationID];\n    tc_te_tc_sampling_result[gl_InvocationID] = 1;\n\n    for (int n_sample = 0; n_sample < N_SAMPLES; ++n_sample)\n    {\n        SAMPLE_FETCH\n\n        if (abs(current_sample.x - reference_colors[n_sample].x) > epsilon ||\n            abs(current_sample.y - reference_colors[n_sample].y) > epsilon ||\n            abs(current_sample.z - reference_colors[n_sample].z) > epsilon ||\n            abs(current_sample.w - reference_colors[n_sample].w) > epsilon)\n        {\n            tc_te_tc_sampling_result[gl_InvocationID] = 0;\n\n            break;\n        }\n    }\n\n   gl_TessLevelInner[0] = 1.0;\n   gl_TessLevelInner[1] = 1.0;\n   gl_TessLevelOuter[0] = 1.0;\n   gl_TessLevelOuter[1] = 1.0;\n   gl_TessLevelOuter[2] = 1.0;\n   gl_TessLevelOuter[3] = 1.0;\n}\n"
             ,&local_2a9);
  std::allocator<char>::~allocator(&local_2a9);
  while (uVar8 = std::__cxx11::string::find((char *)local_2a8,0x2a4f371),
        uVar8 != 0xffffffffffffffff) {
    psVar9 = (string *)strlen("N_SAMPLES");
    std::__cxx11::stringstream::str();
    std::__cxx11::string::replace((ulong)local_2a8,uVar8,psVar9);
    std::__cxx11::string::~string((string *)&te_body);
  }
  while (uVar8 = std::__cxx11::string::find((char *)local_2a8,0x2a4f37b),
        uVar8 != 0xffffffffffffffff) {
    psVar9 = (string *)strlen("SAMPLER_DECLARATIONS");
    std::__cxx11::string::replace((ulong)local_2a8,uVar8,psVar9);
  }
  while (uVar8 = std::__cxx11::string::find((char *)local_2a8,0x2a4f390),
        uVar8 != 0xffffffffffffffff) {
    psVar9 = (string *)strlen("SAMPLE_FETCH");
    std::__cxx11::string::replace((ulong)local_2a8,uVar8,psVar9);
  }
  te_string.field_2._8_8_ = anon_var_dwarf_2fb332;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2f8,
             "#version 400\n\nlayout(quads) in;\n\nin  int  tc_te_vs_sampling_result[];\nin  int  tc_te_tc_sampling_result[];\nout int  te_gs_vs_sampling_result;\nout int  te_gs_tc_sampling_result;\nout int  te_gs_te_sampling_result;\nout vec2 te_gs_uv;\n\nuniform float lod;\nuniform vec4  reference_colors[N_SAMPLES];\nSAMPLER_DECLARATIONS\n\nvoid main()\n{\n    te_gs_vs_sampling_result = tc_te_vs_sampling_result[0];\n    te_gs_tc_sampling_result = tc_te_tc_sampling_result[0];\n    te_gs_te_sampling_result = 1;\n\n    gl_Position.xy = gl_TessCoord.xy * 2.0 - 1.0;\n    gl_Position.zw = vec2(0, 1);\n    te_gs_uv       = vec2(gl_TessCoord.x, 1.0 - gl_TessCoord.y);\n\n\n    const float epsilon = 1.0 / 255.0;\n\n    for (int n_sample = 0; n_sample < N_SAMPLES; ++n_sample)\n    {\n        SAMPLE_FETCH\n\n        if (abs(current_sample.x - reference_colors[n_sample].x) > epsilon ||\n            abs(current_sample.y - reference_colors[n_sample].y) > epsilon ||\n            abs(current_sample.z - reference_colors[n_sample].z) > epsilon ||\n            abs(current_sample.w - reference_colors[n_sample].w) > epsilon)\n        {\n            te_gs_te_sampling_result = 0;\n\n            break;\n        }\n    }\n\n}\n"
             ,&local_2f9);
  std::allocator<char>::~allocator(&local_2f9);
  while (uVar8 = std::__cxx11::string::find((char *)local_2f8,0x2a4f371),
        uVar8 != 0xffffffffffffffff) {
    psVar9 = (string *)strlen("N_SAMPLES");
    std::__cxx11::stringstream::str();
    std::__cxx11::string::replace((ulong)local_2f8,uVar8,psVar9);
    std::__cxx11::string::~string((string *)&gs_body);
  }
  while (uVar8 = std::__cxx11::string::find((char *)local_2f8,0x2a4f37b),
        uVar8 != 0xffffffffffffffff) {
    psVar9 = (string *)strlen("SAMPLER_DECLARATIONS");
    std::__cxx11::string::replace((ulong)local_2f8,uVar8,psVar9);
  }
  while (uVar8 = std::__cxx11::string::find((char *)local_2f8,0x2a4f390),
        uVar8 != 0xffffffffffffffff) {
    psVar9 = (string *)strlen("SAMPLE_FETCH");
    std::__cxx11::string::replace((ulong)local_2f8,uVar8,psVar9);
  }
  gs_string.field_2._8_8_ = anon_var_dwarf_2fb34b;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_348,
             "#version 400\n\nlayout (triangles)                        in;\nlayout (triangle_strip, max_vertices = 3) out;\n\nin  int  te_gs_vs_sampling_result[];\nin  int  te_gs_tc_sampling_result[];\nin  int  te_gs_te_sampling_result[];\nin  vec2 te_gs_uv                [];\nout int  gs_fs_vs_sampling_result;\nout int  gs_fs_tc_sampling_result;\nout int  gs_fs_te_sampling_result;\nout int  gs_fs_gs_sampling_result;\nout vec2 gs_fs_uv;\n\nuniform float lod;\nuniform vec4  reference_colors[N_SAMPLES];\nSAMPLER_DECLARATIONS\n\nvoid main()\n{\n    const float epsilon            = 1.0 / 255.0;\n    int         gs_sampling_result = 1;\n    int         tc_sampling_result = te_gs_tc_sampling_result[0] & te_gs_tc_sampling_result[1] & te_gs_tc_sampling_result[2];\n    int         te_sampling_result = te_gs_te_sampling_result[0] & te_gs_te_sampling_result[1] & te_gs_te_sampling_result[2];\n    int         vs_sampling_result = te_gs_vs_sampling_result[0] & te_gs_vs_sampling_result[1] & te_gs_vs_sampling_result[2];\n\n    for (int n_sample = 0; n_sample < N_SAMPLES; ++n_sample)\n    {\n        SAMPLE_FETCH;\n\n        if (abs(current_sample.x - reference_colors[n_sample].x) > epsilon ||\n            abs(current_sample.y - reference_colors[n_sample].y) > epsilon ||\n            abs(current_sample.z - reference_colors[n_sample].z) > epsilon ||\n            abs(current_sample.w - reference_colors[n_sample].w) > epsilon)\n        {\n            gs_sampling_result = 0;\n\n            break;\n        }\n    }\n\n    gl_Position              = gl_in[0].gl_Position;\n    gs_fs_uv                 = te_gs_uv[0];\n    gs_fs_gs_sampling_result = gs_sampling_result;\n    gs_fs_tc_sampling_result = tc_sampling_result;\n    gs_fs_te_sampling_result = te_sampling_result;\n    gs_fs_vs_sampling_result = vs_sampling_result;\n    EmitVertex();\n\n    gl_Position              = gl_in[1].gl_Position;\n    gs_fs_uv                 = te_gs_uv[1];\n    gs_fs_gs_sampling_result = gs_sampling_result;\n    gs_fs_tc_sampling_result = tc_sampling_result;\n    gs_fs_te_sampling_result = te_sampling_result;\n    gs_fs_vs..." /* TRUNCATED STRING LITERAL */
             ,&local_349);
  std::allocator<char>::~allocator(&local_349);
  while (uVar8 = std::__cxx11::string::find((char *)local_348,0x2a4f371),
        uVar8 != 0xffffffffffffffff) {
    psVar9 = (string *)strlen("N_SAMPLES");
    std::__cxx11::stringstream::str();
    std::__cxx11::string::replace((ulong)local_348,uVar8,psVar9);
    std::__cxx11::string::~string((string *)&fs_body);
  }
  while (uVar8 = std::__cxx11::string::find((char *)local_348,0x2a4f37b),
        uVar8 != 0xffffffffffffffff) {
    psVar9 = (string *)strlen("SAMPLER_DECLARATIONS");
    std::__cxx11::string::replace((ulong)local_348,uVar8,psVar9);
  }
  while (uVar8 = std::__cxx11::string::find((char *)local_348,0x2a4f390),
        uVar8 != 0xffffffffffffffff) {
    psVar9 = (string *)strlen("SAMPLE_FETCH");
    std::__cxx11::string::replace((ulong)local_348,uVar8,psVar9);
  }
  fs_string.field_2._8_8_ = anon_var_dwarf_2fb364;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_398,
             "#version 400\n\nin vec2 gs_fs_uv;\n\nuniform float lod;\nuniform vec4  reference_colors[N_SAMPLES];\nSAMPLER_DECLARATIONS\n\nout vec4 result;\n\nvoid main()\n{\n    const float epsilon = 1.0 / 255.0;\n\n    result = vec4(1.0);\n\n    for (int n_sample = 0; n_sample < N_SAMPLES; ++n_sample)\n    {\n        SAMPLE_FETCH\n\n        if (abs(current_sample.x - reference_colors[n_sample].x) > epsilon ||\n            abs(current_sample.y - reference_colors[n_sample].y) > epsilon ||\n            abs(current_sample.z - reference_colors[n_sample].z) > epsilon ||\n            abs(current_sample.w - reference_colors[n_sample].w) > epsilon)\n        {\n            result = vec4(0.0);\n\n            break;\n        }\n    }\n}\n"
             ,&local_399);
  std::allocator<char>::~allocator(&local_399);
  while (uVar8 = std::__cxx11::string::find((char *)local_398,0x2a4f371),
        uVar8 != 0xffffffffffffffff) {
    psVar9 = (string *)strlen("N_SAMPLES");
    std::__cxx11::stringstream::str();
    std::__cxx11::string::replace((ulong)local_398,uVar8,psVar9);
    std::__cxx11::string::~string((string *)&fs_body_raw_ptr);
  }
  while (uVar8 = std::__cxx11::string::find((char *)local_398,0x2a4f37b),
        uVar8 != 0xffffffffffffffff) {
    psVar9 = (string *)strlen("SAMPLER_DECLARATIONS");
    std::__cxx11::string::replace((ulong)local_398,uVar8,psVar9);
  }
  while (uVar8 = std::__cxx11::string::find((char *)local_398,0x2a4f390),
        uVar8 != 0xffffffffffffffff) {
    psVar9 = (string *)strlen("SAMPLE_FETCH");
    std::__cxx11::string::replace((ulong)local_398,uVar8,psVar9);
  }
  gs_body_raw_ptr = (char *)std::__cxx11::string::c_str();
  tc_body_raw_ptr = (char *)std::__cxx11::string::c_str();
  te_body_raw_ptr = (char *)std::__cxx11::string::c_str();
  vs_body_raw_ptr = (char *)std::__cxx11::string::c_str();
  local_3e8 = (GLchar *)std::__cxx11::string::c_str();
  (**(code **)(local_18 + 0x12b8))(this->m_fs_id,1,&gs_body_raw_ptr,0);
  (**(code **)(local_18 + 0x12b8))(this->m_gs_id,1,&tc_body_raw_ptr,0);
  (**(code **)(local_18 + 0x12b8))(this->m_tc_id,1,&te_body_raw_ptr,0);
  (**(code **)(local_18 + 0x12b8))(this->m_te_id,1,&vs_body_raw_ptr,0);
  (**(code **)(local_18 + 0x12b8))(this->m_vs_id,1,&local_3e8,0);
  dVar4 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar4,"glShaderSource() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1520);
  local_408 = this->m_fs_id;
  n_so_ids = this->m_gs_id;
  so_ids[0] = this->m_tc_id;
  so_ids[1] = this->m_te_id;
  so_ids[2] = this->m_vs_id;
  shader_sources[4]._4_4_ = 5;
  _compile_status = gs_body_raw_ptr;
  shader_sources[0] = tc_body_raw_ptr;
  shader_sources[1] = te_body_raw_ptr;
  shader_sources[2] = vs_body_raw_ptr;
  shader_sources[3] = local_3e8;
  for (so_id = 0; (uint)so_id < 5; so_id = so_id + 1) {
    local_440 = 0;
    temp._1020_4_ = (&local_408)[(uint)so_id];
    (**(code **)(local_18 + 0x248))(temp._1020_4_);
    dVar4 = (**(code **)(local_18 + 0x800))();
    glu::checkError(dVar4,"glCompileShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x152f);
    (**(code **)(local_18 + 0xa70))(temp._1020_4_,0x8b81,&local_440);
    dVar4 = (**(code **)(local_18 + 0x800))();
    glu::checkError(dVar4,"glGetShaderiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x1532);
    if (local_440 != 1) {
      (**(code **)(local_18 + 0xa58))(temp._1020_4_,0x400,0,local_848);
      this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      this_01 = tcu::TestContext::getLog(this_00);
      tcu::TestLog::operator<<
                ((MessageBuilder *)(varying_names + 3),this_01,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)(varying_names + 3),
                           (char (*) [31])"Shader compilation error log:\n");
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [1024])local_848);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [17])"\nShader source:\n");
      pMVar10 = tcu::MessageBuilder::operator<<
                          (pMVar10,(char **)(&compile_status + (ulong)(uint)so_id * 2));
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)(varying_names + 3));
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Shader compilation failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0x153e);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (**(code **)(local_18 + 0x10))(this->m_po_id,temp._1020_4_);
    dVar4 = (**(code **)(local_18 + 0x800))();
    glu::checkError(dVar4,"glAttachShader() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x1543);
  }
  varying_names[1] = "gs_fs_te_sampling_result";
  varying_names[2] = "gs_fs_gs_sampling_result";
  link_status = 0x2a51e14;
  n_varying_names = 0;
  varying_names[0]._0_4_ = 0x2a51e2d;
  varying_names[0]._4_4_ = 0;
  local_9f0[1] = 4;
  (**(code **)(local_18 + 0x14c8))(this->m_po_id,4,&link_status,0x8c8c);
  dVar4 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar4,"glTransformFeedbackVaryings() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x154c);
  local_9f0[0] = 0;
  (**(code **)(local_18 + 0xce8))(this->m_po_id);
  dVar4 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar4,"glLinkProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1552);
  (**(code **)(local_18 + 0x9d8))(this->m_po_id,0x8b82,local_9f0);
  dVar4 = (**(code **)(local_18 + 0x800))();
  glu::checkError(dVar4,"glGetProgramiv() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1555);
  if (local_9f0[0] == 1) {
    GVar5 = (**(code **)(local_18 + 0xb48))(this->m_po_id,"lod");
    this->m_po_lod_location = GVar5;
    GVar5 = (**(code **)(local_18 + 0xb48))(this->m_po_id,"n_face");
    this->m_po_n_face_location = GVar5;
    GVar5 = (**(code **)(local_18 + 0xb48))(this->m_po_id,"reference_colors");
    this->m_po_reference_colors_location = GVar5;
    GVar5 = (**(code **)(local_18 + 0xb48))(this->m_po_id,"texture");
    this->m_po_texture_location = GVar5;
    GVar5 = (**(code **)(local_18 + 0xb48))(this->m_po_id,"z_float");
    this->m_po_z_float_location = GVar5;
    GVar5 = (**(code **)(local_18 + 0xb48))(this->m_po_id,"z_int");
    this->m_po_z_int_location = GVar5;
    if (this->m_po_reference_colors_location != -1) {
      std::__cxx11::string::~string(local_398);
      std::__cxx11::string::~string(local_348);
      std::__cxx11::string::~string(local_2f8);
      std::__cxx11::string::~string(local_2a8);
      std::__cxx11::string::~string(local_258);
      std::__cxx11::string::~string((string *)&token_location);
      std::__cxx11::string::~string((string *)(sample_fetch_fs_string.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(sample_fetch_string.field_2._M_local_buf + 8));
      std::__cxx11::stringstream::~stringstream
                ((stringstream *)(sampler_declarations_string.field_2._M_local_buf + 8));
      return;
    }
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"reference_colors is considered an inactive uniform which is invalid.",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
               ,0x1568);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar7,"Program linking failed.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
             ,0x1559);
  __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void TextureViewTestViewSampling::initIterationSpecificProgramObject()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Release shader/program objects that may have been initialized in previous
	 * iterations.
	 */
	deinitIterationSpecificProgramAndShaderObjects();

	/* Create program and shader objects */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(GL_GEOMETRY_SHADER);
	m_tc_id = gl.createShader(GL_TESS_CONTROL_SHADER);
	m_te_id = gl.createShader(GL_TESS_EVALUATION_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");

	m_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call(s) failed.");

	/* Prepare token replacement strings */
	std::stringstream n_samples_sstream;
	std::string		  sampler_declarations_string;
	std::string		  sample_fetch_string;
	std::string		  sample_fetch_fs_string;
	std::size_t		  token_location			 = std::string::npos;
	const char*		  token_n_samples			 = "N_SAMPLES";
	const char*		  token_sampler_declarations = "SAMPLER_DECLARATIONS";
	const char*		  token_sample_fetch		 = "SAMPLE_FETCH";

	n_samples_sstream << m_iteration_parent_texture_n_samples;

	switch (m_iteration_view_texture_target)
	{
	case GL_TEXTURE_1D:
	{
		sampler_declarations_string = "uniform sampler1D texture;";
		sample_fetch_string			= "vec4 current_sample = textureLod(texture, 0.5,        lod);\n";
		sample_fetch_fs_string		= "vec4 current_sample = textureLod(texture, gs_fs_uv.x, lod);\n";

		break;
	}

	case GL_TEXTURE_1D_ARRAY:
	{
		sampler_declarations_string = "uniform sampler1DArray texture;\n"
									  "uniform float          z_float;\n";

		sample_fetch_string	= "vec4 current_sample = textureLod(texture, vec2(0.5, z_float), lod);\n";
		sample_fetch_fs_string = "vec4 current_sample = textureLod(texture, vec2(gs_fs_uv.x, z_float), lod);\n";

		break;
	}

	case GL_TEXTURE_2D:
	{
		sampler_declarations_string = "uniform sampler2D texture;";
		sample_fetch_string			= "vec4 current_sample = textureLod(texture, vec2(0.5), lod);\n";
		sample_fetch_fs_string		= "vec4 current_sample = textureLod(texture, gs_fs_uv, lod);\n";

		break;
	}

	case GL_TEXTURE_2D_ARRAY:
	{
		sampler_declarations_string = "uniform float          z_float;\n"
									  "uniform sampler2DArray texture;";

		sample_fetch_string	= "vec4 current_sample = textureLod(texture, vec3(vec2(0.5), z_float), lod);\n";
		sample_fetch_fs_string = "vec4 current_sample = textureLod(texture, vec3(gs_fs_uv, z_float), lod);\n";

		break;
	}

	case GL_TEXTURE_2D_MULTISAMPLE:
	{
		sampler_declarations_string = "uniform sampler2DMS texture;";
		sample_fetch_string			= "ivec2 texture_size   = textureSize(texture);\n"
							  "vec4  current_sample = texelFetch (texture,\n"
							  "                                   ivec2(texture_size.xy / ivec2(2)),\n"
							  "                                   n_sample);\n";

		sample_fetch_fs_string = "ivec2 texture_size   = textureSize(texture);\n"
								 "vec4  current_sample = texelFetch (texture,\n"
								 "                                   ivec2(gs_fs_uv * vec2(texture_size)),\n"
								 "                                   n_sample);\n";

		break;
	}

	case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
	{
		sampler_declarations_string = "uniform sampler2DMSArray texture;"
									  "uniform int              z_int;\n";

		sample_fetch_string = "ivec3 texture_size   = textureSize(texture);\n"
							  "vec4  current_sample = texelFetch (texture,\n"
							  "                                   ivec3(texture_size.xy / ivec2(2), z_int),\n"
							  "                                   n_sample);\n";

		sample_fetch_fs_string =
			"ivec3 texture_size = textureSize(texture);\n"
			"vec4  current_sample = texelFetch (texture,\n"
			"                                   ivec3(ivec2(gs_fs_uv * vec2(texture_size).xy), z_int),\n"
			"                                   n_sample);\n";

		break;
	}

	case GL_TEXTURE_3D:
	{
		sampler_declarations_string = "uniform sampler3D texture;"
									  "uniform float     z_float;";

		sample_fetch_string	= "vec4 current_sample = textureLod(texture, vec3(vec2(0.5), z_float), lod);\n";
		sample_fetch_fs_string = "vec4 current_sample = textureLod(texture, vec3(gs_fs_uv, z_float), lod);\n";

		break;
	}

	case GL_TEXTURE_CUBE_MAP:
	{
		sampler_declarations_string = "uniform samplerCube texture;\n"
									  "uniform int         n_face;";

		sample_fetch_string = "vec4 current_sample;\n"
							  "\n"
							  "switch (n_face)\n"
							  "{\n"
							  // GL_TEXTURE_CUBE_MAP_POSITIVE_X
							  "    case 0: current_sample = textureLod(texture, vec3( 1,  0,  0), lod); break;\n"
							  // GL_TEXTURE_CUBE_MAP_NEGATIVE_X
							  "    case 1: current_sample = textureLod(texture, vec3(-1,  0,  0), lod); break;\n"
							  // GL_TEXTURE_CUBE_MAP_POSITIVE_Y
							  "    case 2: current_sample = textureLod(texture, vec3( 0,  1,  0), lod); break;\n"
							  // GL_TEXTURE_CUBE_MAP_NEGATIVE_Y
							  "    case 3: current_sample = textureLod(texture, vec3( 0, -1,  0), lod); break;\n"
							  // GL_TEXTURE_CUBE_MAP_POSITIVE_Z
							  "    case 4: current_sample = textureLod(texture, vec3( 0,  0,  1), lod); break;\n"
							  // GL_TEXTURE_CUBE_MAP_NEGATIVE_Z
							  "    case 5: current_sample = textureLod(texture, vec3( 0,  0, -1), lod); break;\n"
							  "}\n";

		sample_fetch_fs_string =
			"vec4 current_sample;\n"
			"\n"
			"switch (n_face)\n"
			"{\n"
			// GL_TEXTURE_CUBE_MAP_POSITIVE_X
			"    case 0: current_sample = textureLod(texture, normalize(vec3( 1, gs_fs_uv.xy)), lod); break;\n"
			// GL_TEXTURE_CUBE_MAP_NEGATIVE_X
			"    case 1: current_sample = textureLod(texture, normalize(vec3(-1, gs_fs_uv.xy)), lod); break;\n"
			// GL_TEXTURE_CUBE_MAP_POSITIVE_Y
			"    case 2: current_sample = textureLod(texture, normalize(vec3( gs_fs_uv.x, 1,  gs_fs_uv.y)), lod); "
			"break;\n"
			// GL_TEXTURE_CUBE_MAP_NEGATIVE_Y
			"    case 3: current_sample = textureLod(texture, normalize(vec3( gs_fs_uv.x, -1, gs_fs_uv.y)), lod); "
			"break;\n"
			// GL_TEXTURE_CUBE_MAP_POSITIVE_Z
			"    case 4: current_sample = textureLod(texture, normalize(vec3( gs_fs_uv.xy,  1)), lod); break;\n"
			// GL_TEXTURE_CUBE_MAP_NEGATIVE_Z
			"    case 5: current_sample = textureLod(texture, normalize(vec3( gs_fs_uv.xy, -1)), lod); break;\n"
			"}\n";
		break;
	}

	case GL_TEXTURE_CUBE_MAP_ARRAY:
	{
		sampler_declarations_string = "uniform samplerCubeArray texture;\n"
									  "uniform int              n_face;\n"
									  "uniform float            z_float;\n";

		sample_fetch_string =
			"vec4 current_sample;\n"
			"\n"
			"switch (n_face)\n"
			"{\n"
			// GL_TEXTURE_CUBE_MAP_POSITIVE_X
			"    case 0: current_sample = textureLod(texture, vec4( 1,  0,  0, z_float), lod); break;\n"
			// GL_TEXTURE_CUBE_MAP_NEGATIVE_X
			"    case 1: current_sample = textureLod(texture, vec4(-1,  0,  0, z_float), lod); break;\n"
			// GL_TEXTURE_CUBE_MAP_POSITIVE_Y
			"    case 2: current_sample = textureLod(texture, vec4( 0,  1,  0, z_float), lod); break;\n"
			// GL_TEXTURE_CUBE_MAP_NEGATIVE_Y
			"    case 3: current_sample = textureLod(texture, vec4( 0, -1,  0, z_float), lod); break;\n"
			// GL_TEXTURE_CUBE_MAP_POSITIVE_Z
			"    case 4: current_sample = textureLod(texture, vec4( 0,  0,  1, z_float), lod); break;\n"
			// GL_TEXTURE_CUBE_MAP_NEGATIVE_Z
			"    case 5: current_sample = textureLod(texture, vec4( 0,  0, -1, z_float), lod); break;\n"
			"}\n";

		sample_fetch_fs_string = "vec4 current_sample;\n"
								 "\n"
								 "switch (n_face)\n"
								 "{\n"
								 // GL_TEXTURE_CUBE_MAP_POSITIVE_X
								 "    case 0: current_sample = textureLod(texture, vec4(normalize(vec3( 1, "
								 "gs_fs_uv.xy)), z_float), lod); break;\n"
								 // GL_TEXTURE_CUBE_MAP_NEGATIVE_X
								 "    case 1: current_sample = textureLod(texture, vec4(normalize(vec3(-1, "
								 "gs_fs_uv.xy)), z_float), lod); break;\n"
								 // GL_TEXTURE_CUBE_MAP_POSITIVE_Y
								 "    case 2: current_sample = textureLod(texture, vec4(normalize(vec3( gs_fs_uv.x, 1, "
								 " gs_fs_uv.y)), z_float), lod); break;\n"
								 // GL_TEXTURE_CUBE_MAP_NEGATIVE_Y
								 "    case 3: current_sample = textureLod(texture, vec4(normalize(vec3( gs_fs_uv.x, "
								 "-1,  gs_fs_uv.y)), z_float), lod); break;\n"
								 // GL_TEXTURE_CUBE_MAP_POSITIVE_Z
								 "    case 4: current_sample = textureLod(texture, vec4(normalize(vec3( gs_fs_uv.xy, "
								 "1)), z_float), lod); break;\n"
								 // GL_TEXTURE_CUBE_MAP_NEGATIVE_Z
								 "    case 5: current_sample = textureLod(texture, vec4(normalize(vec3( gs_fs_uv.xy, "
								 "-1)), z_float), lod); break;\n"
								 "}\n";

		break;
	}

	case GL_TEXTURE_RECTANGLE:
	{
		sampler_declarations_string = "uniform sampler2DRect texture;";
		sample_fetch_string			= "ivec2 texture_size   = textureSize(texture);\n"
							  "vec4  current_sample = texelFetch (texture, texture_size / ivec2(2));\n";

		sample_fetch_fs_string =
			"ivec2 texture_size   = textureSize(texture);\n"
			"vec4  current_sample = texelFetch (texture, ivec2(gs_fs_uv.xy * vec2(texture_size)));\n";

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized texture target");
	}
	} /* switch (m_iteration_view_texture_target) */

	/* Set vertex shader's body */
	const char* vs_body = "#version 400\n"
						  "\n"
						  "uniform float lod;\n"
						  "uniform vec4 reference_colors[N_SAMPLES];\n"
						  "SAMPLER_DECLARATIONS\n"
						  "\n"
						  "out int vs_tc_vs_sampling_result;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    const float epsilon = 1.0 / 255.0;\n"
						  "\n"
						  "    vs_tc_vs_sampling_result = 1;\n"
						  "\n"
						  "    for (int n_sample = 0; n_sample < N_SAMPLES; ++n_sample)\n"
						  "    {\n"
						  "        SAMPLE_FETCH;\n"
						  "\n"
						  "        if (abs(current_sample.x - reference_colors[n_sample].x) > epsilon ||\n"
						  "            abs(current_sample.y - reference_colors[n_sample].y) > epsilon ||\n"
						  "            abs(current_sample.z - reference_colors[n_sample].z) > epsilon ||\n"
						  "            abs(current_sample.w - reference_colors[n_sample].w) > epsilon)\n"
						  "        {\n"
						  "            vs_tc_vs_sampling_result = int(current_sample.x * 256.0);\n"
						  "\n"
						  "            break;\n"
						  "        }\n"
						  "    }\n"
						  "\n"
						  "    gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n"
						  "}\n";
	std::string vs_string = vs_body;

	while ((token_location = vs_string.find(token_n_samples)) != std::string::npos)
	{
		vs_string.replace(token_location, strlen(token_n_samples), n_samples_sstream.str());
	}

	while ((token_location = vs_string.find(token_sampler_declarations)) != std::string::npos)
	{
		vs_string.replace(token_location, strlen(token_sampler_declarations), sampler_declarations_string);
	}

	while ((token_location = vs_string.find(token_sample_fetch)) != std::string::npos)
	{
		vs_string.replace(token_location, strlen(token_sample_fetch), sample_fetch_string);
	}

	/* Set tessellation control shader's body */
	const char* tc_body = "#version 400\n"
						  "\n"
						  "layout(vertices = 1) out;\n"
						  "\n"
						  "uniform float lod;\n"
						  "uniform vec4  reference_colors[N_SAMPLES];\n"
						  "SAMPLER_DECLARATIONS\n"
						  "\n"
						  "in  int vs_tc_vs_sampling_result[];\n"
						  "out int tc_te_vs_sampling_result[];\n"
						  "out int tc_te_tc_sampling_result[];\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    const float epsilon = 1.0 / 255.0;\n"
						  "\n"
						  "    tc_te_vs_sampling_result[gl_InvocationID] = vs_tc_vs_sampling_result[gl_InvocationID];\n"
						  "    tc_te_tc_sampling_result[gl_InvocationID] = 1;\n"
						  "\n"
						  "    for (int n_sample = 0; n_sample < N_SAMPLES; ++n_sample)\n"
						  "    {\n"
						  "        SAMPLE_FETCH\n"
						  "\n"
						  "        if (abs(current_sample.x - reference_colors[n_sample].x) > epsilon ||\n"
						  "            abs(current_sample.y - reference_colors[n_sample].y) > epsilon ||\n"
						  "            abs(current_sample.z - reference_colors[n_sample].z) > epsilon ||\n"
						  "            abs(current_sample.w - reference_colors[n_sample].w) > epsilon)\n"
						  "        {\n"
						  "            tc_te_tc_sampling_result[gl_InvocationID] = 0;\n"
						  "\n"
						  "            break;\n"
						  "        }\n"
						  "    }\n"
						  "\n"
						  "   gl_TessLevelInner[0] = 1.0;\n"
						  "   gl_TessLevelInner[1] = 1.0;\n"
						  "   gl_TessLevelOuter[0] = 1.0;\n"
						  "   gl_TessLevelOuter[1] = 1.0;\n"
						  "   gl_TessLevelOuter[2] = 1.0;\n"
						  "   gl_TessLevelOuter[3] = 1.0;\n"
						  "}\n";

	std::string tc_string = tc_body;

	while ((token_location = tc_string.find(token_n_samples)) != std::string::npos)
	{
		tc_string.replace(token_location, strlen(token_n_samples), n_samples_sstream.str());
	}

	while ((token_location = tc_string.find(token_sampler_declarations)) != std::string::npos)
	{
		tc_string.replace(token_location, strlen(token_sampler_declarations), sampler_declarations_string);
	}

	while ((token_location = tc_string.find(token_sample_fetch)) != std::string::npos)
	{
		tc_string.replace(token_location, strlen(token_sample_fetch), sample_fetch_string);
	}

	/* Set tessellation evaluation shader's body */
	const char* te_body = "#version 400\n"
						  "\n"
						  "layout(quads) in;\n"
						  "\n"
						  "in  int  tc_te_vs_sampling_result[];\n"
						  "in  int  tc_te_tc_sampling_result[];\n"
						  "out int  te_gs_vs_sampling_result;\n"
						  "out int  te_gs_tc_sampling_result;\n"
						  "out int  te_gs_te_sampling_result;\n"
						  "out vec2 te_gs_uv;\n"
						  "\n"
						  "uniform float lod;\n"
						  "uniform vec4  reference_colors[N_SAMPLES];\n"
						  "SAMPLER_DECLARATIONS\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    te_gs_vs_sampling_result = tc_te_vs_sampling_result[0];\n"
						  "    te_gs_tc_sampling_result = tc_te_tc_sampling_result[0];\n"
						  "    te_gs_te_sampling_result = 1;\n"
						  "\n"
						  /* gl_TessCoord spans from 0 to 1 for XY. To generate a screen-space quad,
		 * we need to project these components to <-1, 1>. */
						  "    gl_Position.xy = gl_TessCoord.xy * 2.0 - 1.0;\n"
						  "    gl_Position.zw = vec2(0, 1);\n"
						  "    te_gs_uv       = vec2(gl_TessCoord.x, 1.0 - gl_TessCoord.y);\n"
						  "\n"
						  "\n"
						  "    const float epsilon = 1.0 / 255.0;\n"
						  "\n"
						  "    for (int n_sample = 0; n_sample < N_SAMPLES; ++n_sample)\n"
						  "    {\n"
						  "        SAMPLE_FETCH\n"
						  "\n"
						  "        if (abs(current_sample.x - reference_colors[n_sample].x) > epsilon ||\n"
						  "            abs(current_sample.y - reference_colors[n_sample].y) > epsilon ||\n"
						  "            abs(current_sample.z - reference_colors[n_sample].z) > epsilon ||\n"
						  "            abs(current_sample.w - reference_colors[n_sample].w) > epsilon)\n"
						  "        {\n"
						  "            te_gs_te_sampling_result = 0;\n"
						  "\n"
						  "            break;\n"
						  "        }\n"
						  "    }\n"
						  "\n"
						  "}\n";

	std::string te_string = te_body;

	while ((token_location = te_string.find(token_n_samples)) != std::string::npos)
	{
		te_string.replace(token_location, strlen(token_n_samples), n_samples_sstream.str());
	}

	while ((token_location = te_string.find(token_sampler_declarations)) != std::string::npos)
	{
		te_string.replace(token_location, strlen(token_sampler_declarations), sampler_declarations_string);
	}

	while ((token_location = te_string.find(token_sample_fetch)) != std::string::npos)
	{
		te_string.replace(token_location, strlen(token_sample_fetch), sample_fetch_string);
	}

	/* Set geometry shader's body */
	const char* gs_body = "#version 400\n"
						  "\n"
						  "layout (triangles)                        in;\n"
						  "layout (triangle_strip, max_vertices = 3) out;\n"
						  "\n"
						  "in  int  te_gs_vs_sampling_result[];\n"
						  "in  int  te_gs_tc_sampling_result[];\n"
						  "in  int  te_gs_te_sampling_result[];\n"
						  "in  vec2 te_gs_uv                [];\n"
						  "out int  gs_fs_vs_sampling_result;\n"
						  "out int  gs_fs_tc_sampling_result;\n"
						  "out int  gs_fs_te_sampling_result;\n"
						  "out int  gs_fs_gs_sampling_result;\n"
						  "out vec2 gs_fs_uv;\n"
						  "\n"
						  "uniform float lod;\n"
						  "uniform vec4  reference_colors[N_SAMPLES];\n"
						  "SAMPLER_DECLARATIONS\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    const float epsilon            = 1.0 / 255.0;\n"
						  "    int         gs_sampling_result = 1;\n"
						  "    int         tc_sampling_result = te_gs_tc_sampling_result[0] & "
						  "te_gs_tc_sampling_result[1] & te_gs_tc_sampling_result[2];\n"
						  "    int         te_sampling_result = te_gs_te_sampling_result[0] & "
						  "te_gs_te_sampling_result[1] & te_gs_te_sampling_result[2];\n"
						  "    int         vs_sampling_result = te_gs_vs_sampling_result[0] & "
						  "te_gs_vs_sampling_result[1] & te_gs_vs_sampling_result[2];\n"
						  "\n"
						  "    for (int n_sample = 0; n_sample < N_SAMPLES; ++n_sample)\n"
						  "    {\n"
						  "        SAMPLE_FETCH;\n"
						  "\n"
						  "        if (abs(current_sample.x - reference_colors[n_sample].x) > epsilon ||\n"
						  "            abs(current_sample.y - reference_colors[n_sample].y) > epsilon ||\n"
						  "            abs(current_sample.z - reference_colors[n_sample].z) > epsilon ||\n"
						  "            abs(current_sample.w - reference_colors[n_sample].w) > epsilon)\n"
						  "        {\n"
						  "            gs_sampling_result = 0;\n"
						  "\n"
						  "            break;\n"
						  "        }\n"
						  "    }\n"
						  "\n"
						  "    gl_Position              = gl_in[0].gl_Position;\n"
						  "    gs_fs_uv                 = te_gs_uv[0];\n"
						  "    gs_fs_gs_sampling_result = gs_sampling_result;\n"
						  "    gs_fs_tc_sampling_result = tc_sampling_result;\n"
						  "    gs_fs_te_sampling_result = te_sampling_result;\n"
						  "    gs_fs_vs_sampling_result = vs_sampling_result;\n"
						  "    EmitVertex();\n"
						  "\n"
						  "    gl_Position              = gl_in[1].gl_Position;\n"
						  "    gs_fs_uv                 = te_gs_uv[1];\n"
						  "    gs_fs_gs_sampling_result = gs_sampling_result;\n"
						  "    gs_fs_tc_sampling_result = tc_sampling_result;\n"
						  "    gs_fs_te_sampling_result = te_sampling_result;\n"
						  "    gs_fs_vs_sampling_result = vs_sampling_result;\n"
						  "    EmitVertex();\n"
						  "\n"
						  "    gl_Position              = gl_in[2].gl_Position;\n"
						  "    gs_fs_uv                 = te_gs_uv[2];\n"
						  "    gs_fs_gs_sampling_result = gs_sampling_result;\n"
						  "    gs_fs_tc_sampling_result = tc_sampling_result;\n"
						  "    gs_fs_te_sampling_result = te_sampling_result;\n"
						  "    gs_fs_vs_sampling_result = vs_sampling_result;\n"
						  "    EmitVertex();\n"
						  "    EndPrimitive();\n"
						  "}\n";

	std::string gs_string = gs_body;

	while ((token_location = gs_string.find(token_n_samples)) != std::string::npos)
	{
		gs_string.replace(token_location, strlen(token_n_samples), n_samples_sstream.str());
	}

	while ((token_location = gs_string.find(token_sampler_declarations)) != std::string::npos)
	{
		gs_string.replace(token_location, strlen(token_sampler_declarations), sampler_declarations_string);
	}

	while ((token_location = gs_string.find(token_sample_fetch)) != std::string::npos)
	{
		gs_string.replace(token_location, strlen(token_sample_fetch), sample_fetch_string);
	}

	/* Set fragment shader's body */
	const char* fs_body = "#version 400\n"
						  "\n"
						  "in vec2 gs_fs_uv;\n"
						  "\n"
						  "uniform float lod;\n"
						  "uniform vec4  reference_colors[N_SAMPLES];\n"
						  "SAMPLER_DECLARATIONS\n"
						  "\n"
						  "out vec4 result;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    const float epsilon = 1.0 / 255.0;\n"
						  "\n"
						  "    result = vec4(1.0);\n"
						  "\n"
						  "    for (int n_sample = 0; n_sample < N_SAMPLES; ++n_sample)\n"
						  "    {\n"
						  "        SAMPLE_FETCH\n"
						  "\n"
						  "        if (abs(current_sample.x - reference_colors[n_sample].x) > epsilon ||\n"
						  "            abs(current_sample.y - reference_colors[n_sample].y) > epsilon ||\n"
						  "            abs(current_sample.z - reference_colors[n_sample].z) > epsilon ||\n"
						  "            abs(current_sample.w - reference_colors[n_sample].w) > epsilon)\n"
						  "        {\n"
						  "            result = vec4(0.0);\n"
						  "\n"
						  "            break;\n"
						  "        }\n"
						  "    }\n"
						  "}\n";

	std::string fs_string = fs_body;

	while ((token_location = fs_string.find(token_n_samples)) != std::string::npos)
	{
		fs_string.replace(token_location, strlen(token_n_samples), n_samples_sstream.str());
	}

	while ((token_location = fs_string.find(token_sampler_declarations)) != std::string::npos)
	{
		fs_string.replace(token_location, strlen(token_sampler_declarations), sampler_declarations_string);
	}

	while ((token_location = fs_string.find(token_sample_fetch)) != std::string::npos)
	{
		fs_string.replace(token_location, strlen(token_sample_fetch), sample_fetch_fs_string);
	}

	/* Configure shader bodies */
	const char* fs_body_raw_ptr = fs_string.c_str();
	const char* gs_body_raw_ptr = gs_string.c_str();
	const char* tc_body_raw_ptr = tc_string.c_str();
	const char* te_body_raw_ptr = te_string.c_str();
	const char* vs_body_raw_ptr = vs_string.c_str();

	gl.shaderSource(m_fs_id, 1 /* count */, &fs_body_raw_ptr, NULL /* length */);
	gl.shaderSource(m_gs_id, 1 /* count */, &gs_body_raw_ptr, NULL /* length */);
	gl.shaderSource(m_tc_id, 1 /* count */, &tc_body_raw_ptr, NULL /* length */);
	gl.shaderSource(m_te_id, 1 /* count */, &te_body_raw_ptr, NULL /* length */);
	gl.shaderSource(m_vs_id, 1 /* count */, &vs_body_raw_ptr, NULL /* length */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call(s) failed.");

	/* Compile the shaders */
	const glw::GLuint  so_ids[] = { m_fs_id, m_gs_id, m_tc_id, m_te_id, m_vs_id };
	const unsigned int n_so_ids = sizeof(so_ids) / sizeof(so_ids[0]);

	const glw::GLchar* shader_sources[] = { fs_body_raw_ptr, gs_body_raw_ptr, tc_body_raw_ptr, te_body_raw_ptr,
											vs_body_raw_ptr };

	for (unsigned int n_so_id = 0; n_so_id < n_so_ids; ++n_so_id)
	{
		glw::GLint compile_status = GL_FALSE;
		glw::GLint so_id		  = so_ids[n_so_id];

		gl.compileShader(so_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

		gl.getShaderiv(so_id, GL_COMPILE_STATUS, &compile_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

		if (compile_status != GL_TRUE)
		{
			char temp[1024];

			gl.getShaderInfoLog(so_id, 1024, NULL, temp);

			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Shader compilation error log:\n"
												<< temp << "\nShader source:\n"
												<< shader_sources[n_so_id] << tcu::TestLog::EndMessage;

			TCU_FAIL("Shader compilation failed");
		}

		/* Attach the shaders to the program object */
		gl.attachShader(m_po_id, so_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call failed");
	} /* for (all shader objects) */

	/* Set up XFB */
	const char* varying_names[] = { "gs_fs_vs_sampling_result", "gs_fs_tc_sampling_result", "gs_fs_te_sampling_result",
									"gs_fs_gs_sampling_result" };
	const unsigned int n_varying_names = sizeof(varying_names) / sizeof(varying_names[0]);

	gl.transformFeedbackVaryings(m_po_id, n_varying_names, varying_names, GL_INTERLEAVED_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call failed.");

	/* Link the program object */
	glw::GLint link_status = GL_FALSE;

	gl.linkProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

	gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

	if (link_status != GL_TRUE)
	{
		TCU_FAIL("Program linking failed.");
	}

	/* Retrieve uniform locations. Depending on the iteration, a number of those will be
	 * inactive.
	 */
	m_po_lod_location			   = gl.getUniformLocation(m_po_id, "lod");
	m_po_n_face_location		   = gl.getUniformLocation(m_po_id, "n_face");
	m_po_reference_colors_location = gl.getUniformLocation(m_po_id, "reference_colors");
	m_po_texture_location		   = gl.getUniformLocation(m_po_id, "texture");
	m_po_z_float_location		   = gl.getUniformLocation(m_po_id, "z_float");
	m_po_z_int_location			   = gl.getUniformLocation(m_po_id, "z_int");

	if (m_po_reference_colors_location == -1)
	{
		TCU_FAIL("reference_colors is considered an inactive uniform which is invalid.");
	}
}